

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<Fad<Fad<double>_>_>::TPZVec(TPZVec<Fad<Fad<double>_>_> *this,int64_t size)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  int64_t *piVar5;
  long lVar6;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01816710;
  this->fStore = (Fad<Fad<double>_> *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<Fad<Fad<double>>>::TPZVec(const int64_t) [T = Fad<Fad<double>>]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = size;
      uVar3 = SUB168(auVar2 * ZEXT816(0x58),0);
      uVar4 = uVar3 + 8;
      if (0xfffffffffffffff7 < uVar3) {
        uVar4 = 0xffffffffffffffff;
      }
      uVar3 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x58),8) == 0) {
        uVar3 = uVar4;
      }
      piVar5 = (int64_t *)operator_new__(uVar3);
      *piVar5 = size;
      lVar6 = 0;
      do {
        *(undefined8 *)((long)piVar5 + lVar6 + 0x10) = 0;
        *(undefined4 *)((long)piVar5 + lVar6 + 0x18) = 0;
        puVar1 = (undefined8 *)((long)piVar5 + lVar6 + 0x50);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar5 + lVar6 + 0x30) = 0;
        puVar1 = (undefined8 *)((long)piVar5 + lVar6 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar5 + lVar6 + 0x48) = 0;
        puVar1 = (undefined8 *)((long)piVar5 + lVar6 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar6 = lVar6 + 0x58;
      } while (size * 0x58 - lVar6 != 0);
      this->fStore = (Fad<Fad<double>_> *)(piVar5 + 1);
    }
    this->fNElements = size;
    this->fNAlloc = size;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}